

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darCut.c
# Opt level: O0

int Dar_CutFilter(Aig_Obj_t *pObj,Dar_Cut_t *pCut)

{
  int iVar1;
  int local_2c;
  Dar_Cut_t *pDStack_28;
  int i;
  Dar_Cut_t *pTemp;
  Dar_Cut_t *pCut_local;
  Aig_Obj_t *pObj_local;
  
  if ((*(uint *)&pCut->field_0x4 >> 0x1c & 1) == 0) {
    __assert_fail("pCut->fUsed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dar/darCut.c"
                  ,0xdd,"int Dar_CutFilter(Aig_Obj_t *, Dar_Cut_t *)");
  }
  pDStack_28 = Dar_ObjCuts(pObj);
  local_2c = 0;
  do {
    if ((int)(uint)(byte)((ulong)*(undefined8 *)&pObj->field_0x18 >> 0x38) <= local_2c) {
      return 0;
    }
    if (((*(uint *)&pDStack_28->field_0x4 >> 0x1c & 1) != 0) && (pDStack_28 != pCut)) {
      if (*(uint *)&pCut->field_0x4 >> 0x1d < *(uint *)&pDStack_28->field_0x4 >> 0x1d) {
        if (((pDStack_28->uSign & pCut->uSign) == pCut->uSign) &&
           (iVar1 = Dar_CutCheckDominance(pCut,pDStack_28), iVar1 != 0)) {
          *(uint *)&pDStack_28->field_0x4 = *(uint *)&pDStack_28->field_0x4 & 0xefffffff;
        }
      }
      else if (((pDStack_28->uSign & pCut->uSign) == pDStack_28->uSign) &&
              (iVar1 = Dar_CutCheckDominance(pDStack_28,pCut), iVar1 != 0)) {
        *(uint *)&pCut->field_0x4 = *(uint *)&pCut->field_0x4 & 0xefffffff;
        return 1;
      }
    }
    local_2c = local_2c + 1;
    pDStack_28 = pDStack_28 + 1;
  } while( true );
}

Assistant:

static inline int Dar_CutFilter( Aig_Obj_t * pObj, Dar_Cut_t * pCut )
{ 
    Dar_Cut_t * pTemp;
    int i;
    assert( pCut->fUsed );
    // go through the cuts of the node
    Dar_ObjForEachCut( pObj, pTemp, i )
    {
        if ( pTemp == pCut )
            continue;
        if ( pTemp->nLeaves > pCut->nLeaves )
        {
            // skip the non-contained cuts
            if ( (pTemp->uSign & pCut->uSign) != pCut->uSign )
                continue;
            // check containment seriously
            if ( Dar_CutCheckDominance( pCut, pTemp ) )
            {
                // remove contained cut
                pTemp->fUsed = 0;
            }
         }
        else
        {
            // skip the non-contained cuts
            if ( (pTemp->uSign & pCut->uSign) != pTemp->uSign )
                continue;
            // check containment seriously
            if ( Dar_CutCheckDominance( pTemp, pCut ) )
            {
                // remove the given cut
                pCut->fUsed = 0;
                return 1;
            }
        }
    }
    return 0;
}